

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool anon_unknown.dwarf_7587be::extract_tar(char *outFileName,bool verbose,bool extract)

{
  FILE *__stream;
  archive_entry *entry_00;
  _Alloc_hider _Var1;
  wchar_t wVar2;
  uint uVar3;
  mode_t mVar4;
  int iVar5;
  char *pcVar6;
  archive *a;
  archive *_a;
  Encoding *pEVar7;
  size_t sVar8;
  wstring *__s;
  la_int64_t lVar9;
  ulong uVar10;
  dev_t dVar11;
  dev_t dVar12;
  tm *__tp;
  la_ssize_t lVar13;
  char *cstr;
  wchar_t *wcstr;
  wchar_t *wcstr_00;
  wchar_t *wcstr_01;
  wchar_t *wcstr_02;
  undefined7 in_register_00000031;
  char *__format;
  bool bVar14;
  archive_entry *entry;
  time_t tim;
  char tmp [100];
  size_t size;
  archive_entry *local_e0;
  time_t local_d8;
  undefined4 local_cc;
  size_t local_c8;
  char *local_c0;
  wstring local_b8 [3];
  string local_50;
  
  local_cc = (undefined4)CONCAT71(in_register_00000031,verbose);
  pcVar6 = setlocale(0,(char *)0x0);
  setlocale(0,"");
  local_c0 = pcVar6;
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  cmsys::Encoding::ToWide_abi_cxx11_(local_b8,(Encoding *)outFileName,cstr);
  wVar2 = archive_read_open_filename_w(a,local_b8[0]._M_dataplus._M_p,0x2800);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
    operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity * 4 + 4);
  }
  if (wVar2 == L'\0') {
LAB_0035ff06:
    do {
      wVar2 = archive_read_next_header(a,&local_e0);
      entry_00 = local_e0;
      __stream = _stdout;
      if (wVar2 != L'\0') {
        if (wVar2 != L'\x01') {
          pcVar6 = archive_error_string(a);
          cmSystemTools::Error
                    ("Problem with archive_read_next_header(): ",pcVar6,(char *)0x0,(char *)0x0);
        }
        goto LAB_00360405;
      }
      if ((char)local_cc == '\0') {
        if (!extract) {
          pEVar7 = (Encoding *)archive_entry_pathname_w(local_e0);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_b8,pEVar7,wcstr_00);
          _Var1._M_p = local_b8[0]._M_dataplus._M_p;
          sVar8 = strlen((char *)local_b8[0]._M_dataplus._M_p);
          cmSystemTools::Stdout((char *)_Var1._M_p,sVar8);
          goto LAB_0035ffa7;
        }
      }
      else {
        if (extract) {
          cmSystemTools::Stdout("x ",2);
          pEVar7 = (Encoding *)archive_entry_pathname_w(local_e0);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_b8,pEVar7,wcstr);
          _Var1._M_p = local_b8[0]._M_dataplus._M_p;
          sVar8 = strlen((char *)local_b8[0]._M_dataplus._M_p);
          cmSystemTools::Stdout((char *)_Var1._M_p,sVar8);
LAB_0035ffa7:
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
            operator_delete(local_b8[0]._M_dataplus._M_p,
                            local_b8[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
            time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
          }
          pcVar6 = archive_entry_strmode((archive_entry_conflict *)entry_00);
          uVar3 = archive_entry_nlink(entry_00);
          fprintf(__stream,"%s %d ",pcVar6,(ulong)uVar3);
          __s = (wstring *)archive_entry_uname(entry_00);
          if ((__s == (wstring *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
            lVar9 = archive_entry_uid(entry_00);
            sprintf((char *)local_b8,"%lu ",lVar9);
            __s = local_b8;
          }
          uVar10 = strlen((char *)__s);
          if (uVar10 < 7) {
            uVar10 = 6;
          }
          fprintf(__stream,"%-*s ",uVar10 & 0xffffffff,__s);
          pcVar6 = archive_entry_gname(entry_00);
          if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
            lVar9 = archive_entry_gid(entry_00);
            sprintf((char *)local_b8,"%lu",lVar9);
            local_c8 = strlen((char *)local_b8);
            fputs((char *)local_b8,__stream);
          }
          else {
            fputs(pcVar6,__stream);
            local_c8 = strlen(pcVar6);
          }
          mVar4 = archive_entry_filetype(entry_00);
          if (mVar4 == 0x2000) {
LAB_0036010b:
            dVar11 = archive_entry_rdevmajor(entry_00);
            dVar12 = archive_entry_rdevminor(entry_00);
            sprintf((char *)local_b8,"%lu,%lu",dVar11,dVar12);
          }
          else {
            mVar4 = archive_entry_filetype(entry_00);
            if (mVar4 == 0x6000) goto LAB_0036010b;
            lVar9 = archive_entry_size(entry_00);
            sprintf((char *)local_b8,"%lu",lVar9);
          }
          sVar8 = strlen((char *)local_b8);
          iVar5 = (int)(sVar8 + local_c8) + 1;
          if (sVar8 + local_c8 < 0xd) {
            iVar5 = 0xd;
          }
          fprintf(__stream,"%*s",(ulong)(uint)(iVar5 - (int)local_c8),local_b8);
          local_d8 = archive_entry_mtime(entry_00);
          pcVar6 = "%e %b %H:%M";
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
              local_d8) {
            pcVar6 = "%e %b  %Y";
          }
          if (local_d8 <
              (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + -0xf099c0) {
            pcVar6 = "%e %b  %Y";
          }
          __tp = localtime(&local_d8);
          strftime((char *)local_b8,100,pcVar6,__tp);
          fprintf(__stream," %s ",local_b8);
          pEVar7 = (Encoding *)archive_entry_pathname_w(entry_00);
          cmsys::Encoding::ToNarrow_abi_cxx11_(&local_50,pEVar7,wcstr_01);
          fputs(local_50._M_dataplus._M_p,__stream);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = archive_entry_hardlink(entry_00);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = archive_entry_symlink(entry_00);
            if (pcVar6 == (char *)0x0) goto LAB_00360293;
            pcVar6 = archive_entry_symlink(entry_00);
            __format = " -> %s";
          }
          else {
            pcVar6 = archive_entry_hardlink(entry_00);
            __format = " link to %s";
          }
          fprintf(__stream,__format,pcVar6);
        }
LAB_00360293:
        cmSystemTools::Stdout("\n",1);
        if (!extract) goto LAB_0035ff06;
      }
      wVar2 = archive_write_disk_set_options(_a,L'\x04');
      if (wVar2 != L'\0') {
        pcVar6 = archive_error_string(_a);
        cmSystemTools::Error
                  ("Problem with archive_write_disk_set_options(): ",pcVar6,(char *)0x0,(char *)0x0)
        ;
        goto LAB_00360405;
      }
      wVar2 = archive_write_header(_a,local_e0);
      if (wVar2 != L'\0') {
        pcVar6 = archive_error_string(_a);
        cmSystemTools::Error("Problem with archive_write_header(): ",pcVar6,(char *)0x0,(char *)0x0)
        ;
        pEVar7 = (Encoding *)archive_entry_pathname_w(local_e0);
        cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_b8,pEVar7,wcstr_02);
        cmSystemTools::Error
                  ("Current file: ",(char *)local_b8[0]._M_dataplus._M_p,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
          operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1
                         );
        }
        goto LAB_00360405;
      }
      do {
        iVar5 = archive_read_data_block(a,(void **)local_b8,(size_t *)&local_50,&local_d8);
        if (iVar5 != 0) goto LAB_0036032a;
        lVar13 = archive_write_data_block
                           (_a,local_b8[0]._M_dataplus._M_p,(size_t)local_50._M_dataplus._M_p,
                            local_d8);
      } while (lVar13 == 0);
      pcVar6 = archive_error_string(_a);
      cmSystemTools::Message("archive_write_data_block()",pcVar6);
LAB_0036032a:
      wVar2 = archive_write_finish_entry(_a);
      if (wVar2 != L'\0') goto LAB_0036033c;
    } while( true );
  }
  pcVar6 = archive_error_string(a);
  cmSystemTools::Error("Problem with archive_read_open_file(): ",pcVar6,(char *)0x0,(char *)0x0);
  archive_write_free(_a);
  archive_read_close(a);
  bVar14 = false;
LAB_00360423:
  setlocale(0,local_c0);
  return bVar14;
LAB_0036033c:
  pcVar6 = archive_error_string(_a);
  cmSystemTools::Error("Problem with archive_write_finish_entry(): ",pcVar6,(char *)0x0,(char *)0x0)
  ;
LAB_00360405:
  archive_write_free(_a);
  archive_read_close(a);
  archive_read_free(a);
  bVar14 = wVar2 == L'\x01';
  goto LAB_00360423;
}

Assistant:

bool extract_tar(const char* outFileName, bool verbose,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive *ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry *entry;
  int r = cm_archive_read_open_file(a, outFileName, 10240);
  if(r)
    {
    cmSystemTools::Error("Problem with archive_read_open_file(): ",
                         archive_error_string(a));
    archive_write_free(ext);
    archive_read_close(a);
    return false;
    }
  for (;;)
    {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF)
      {
      break;
      }
    if (r != ARCHIVE_OK)
      {
      cmSystemTools::Error("Problem with archive_read_next_header(): ",
                           archive_error_string(a));
      break;
      }
    if(verbose)
      {
      if(extract)
        {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
        }
      else
        {
        list_item_verbose(stdout, entry);
        }
      cmSystemTools::Stdout("\n");
      }
    else if(!extract)
      {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
      cmSystemTools::Stdout("\n");
      }
    if(extract)
      {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK)
        {
        cmSystemTools::Error(
          "Problem with archive_write_disk_set_options(): ",
          archive_error_string(ext));
        break;
        }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK)
        {
        copy_data(a, ext);
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK)
          {
          cmSystemTools::Error("Problem with archive_write_finish_entry(): ",
                               archive_error_string(ext));
          break;
          }
        }
#ifdef _WIN32
      else if(const char* linktext = archive_entry_symlink(entry))
        {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry)
                  << "\" -> \""
                  << linktext << "\"." << std::endl;
        }
#endif
      else
        {
        cmSystemTools::Error("Problem with archive_write_header(): ",
                             archive_error_string(ext));
        cmSystemTools::Error("Current file: ",
                             cm_archive_entry_pathname(entry).c_str());
        break;
        }
      }
    }